

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O1

void __thiscall uv::Exception::~Exception(Exception *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__Exception_00106d60;
  pcVar1 = (this->msg_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg_).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~Exception() throw() {}